

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void __thiscall
fmt::v11::detail::format_error_code
          (detail *this,buffer<char> *out,int error_code,string_view message)

{
  uint uVar1;
  ulong uVar2;
  undefined4 in_register_00000014;
  buffer<char> *buf;
  int iVar3;
  uint uVar4;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  char *local_38;
  char *local_30;
  char *local_28;
  
  local_38 = (char *)CONCAT44(in_register_00000014,error_code);
  iVar3 = (int)out;
  *(undefined8 *)(this + 8) = 0;
  uVar2 = (ulong)(uint)-iVar3;
  if (0 < iVar3) {
    uVar2 = (ulong)out & 0xffffffff;
  }
  uVar4 = (uint)uVar2 | 1;
  uVar1 = 0x1f;
  if (uVar4 != 0) {
    for (; uVar4 >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  if (-1 < (long)(uVar2 + *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar1 * 8))) {
    if (message.data_ <=
        (char *)(0x1ec - (((ulong)out >> 0x1f & 1) +
                         (uVar2 + *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar1 * 8)
                         >> 0x20)))) {
      local_28 = ": ";
      fmt.size_ = 4;
      fmt.data_ = "{}{}";
      args.field_1.values_ = (value<fmt::v11::context> *)&local_38;
      args.desc_ = 0xcd;
      local_30 = message.data_;
      vformat_to((buffer<char> *)this,fmt,args,(locale_ref)0x0);
    }
    local_38 = "error ";
    local_28 = (char *)CONCAT44(local_28._4_4_,iVar3);
    fmt_00.size_ = 4;
    fmt_00.data_ = "{}{}";
    args_00.field_1.values_ = (value<fmt::v11::context> *)&local_38;
    args_00.desc_ = 0x1c;
    vformat_to((buffer<char> *)this,fmt_00,args_00,(locale_ref)0x0);
    if (*(ulong *)(this + 8) < 0x1f5) {
      return;
    }
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O3/_deps/fmt-src/include/fmt/format-inl.h"
                ,0x3f,"");
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O3/_deps/fmt-src/include/fmt/base.h"
              ,0x1b6,"negative value");
}

Assistant:

FMT_FUNC void format_error_code(detail::buffer<char>& out, int error_code,
                                string_view message) noexcept {
  // Report error code making sure that the output fits into
  // inline_buffer_size to avoid dynamic memory allocation and potential
  // bad_alloc.
  out.try_resize(0);
  static const char SEP[] = ": ";
  static const char ERROR_STR[] = "error ";
  // Subtract 2 to account for terminating null characters in SEP and ERROR_STR.
  size_t error_code_size = sizeof(SEP) + sizeof(ERROR_STR) - 2;
  auto abs_value = static_cast<uint32_or_64_or_128_t<int>>(error_code);
  if (detail::is_negative(error_code)) {
    abs_value = 0 - abs_value;
    ++error_code_size;
  }
  error_code_size += detail::to_unsigned(detail::count_digits(abs_value));
  auto it = appender(out);
  if (message.size() <= inline_buffer_size - error_code_size)
    fmt::format_to(it, FMT_STRING("{}{}"), message, SEP);
  fmt::format_to(it, FMT_STRING("{}{}"), ERROR_STR, error_code);
  FMT_ASSERT(out.size() <= inline_buffer_size, "");
}